

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim_encode.c
# Opt level: O1

void WebPUtilClearPic(WebPPicture *picture,FrameRectangle *rect)

{
  int iVar1;
  int iVar2;
  uint32_t *puVar3;
  int iVar4;
  int iVar5;
  
  if (rect != (FrameRectangle *)0x0) {
    ClearRectangle(picture,rect->x_offset_,rect->y_offset_,rect->width_,rect->height_);
    return;
  }
  iVar1 = picture->height;
  if (0 < iVar1) {
    iVar2 = picture->width;
    iVar4 = 1;
    if (1 < iVar2) {
      iVar4 = iVar2;
    }
    puVar3 = picture->argb;
    iVar5 = 0;
    do {
      if (0 < iVar2) {
        memset(puVar3 + picture->argb_stride * iVar5,0,(ulong)(iVar4 - 1) * 4 + 4);
      }
      iVar5 = iVar5 + 1;
    } while (iVar1 != iVar5);
  }
  return;
}

Assistant:

static void WebPUtilClearPic(WebPPicture* const picture,
                             const FrameRectangle* const rect) {
  if (rect != NULL) {
    ClearRectangle(picture, rect->x_offset_, rect->y_offset_,
                   rect->width_, rect->height_);
  } else {
    ClearRectangle(picture, 0, 0, picture->width, picture->height);
  }
}